

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnumValue
          (DescriptorBuilder *this,EnumValueDescriptorProto *proto,EnumDescriptor *parent,
          EnumValueDescriptor *result,FlatAllocator *alloc)

{
  FileDescriptorTables *this_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  string_view sVar1;
  undefined8 this_01;
  FlatAllocator *descriptor;
  EnumValueDescriptor *parent_00;
  EnumDescriptor *pEVar2;
  bool bVar3;
  bool bVar4;
  int32_t iVar5;
  size_type sVar6;
  size_type sVar7;
  const_pointer pvVar8;
  string *psVar9;
  Descriptor *pDVar10;
  Symbol SVar11;
  ulong uVar12;
  string_view sVar13;
  string_view sVar14;
  anon_class_24_3_3de4daac local_290;
  VoidPtr local_278;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_270;
  string_view local_268;
  AlphaNum local_258;
  AlphaNum local_228;
  AlphaNum local_1f8;
  string local_1c8;
  allocator<char> local_1a1;
  string_view local_1a0;
  string local_190 [39];
  allocator<char> local_169;
  string_view local_168;
  string local_158 [32];
  undefined1 local_138 [8];
  string outer_scope;
  bool added_to_inner_scope;
  undefined1 auStack_c8 [7];
  bool added_to_outer_scope;
  string_view local_b8;
  string_view local_a8;
  string_view local_98;
  string_view local_88 [2];
  string_view local_68;
  long local_58;
  size_t scope_len;
  string full_name;
  FlatAllocator *alloc_local;
  EnumValueDescriptor *result_local;
  EnumDescriptor *parent_local;
  EnumValueDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  full_name.field_2._8_8_ = alloc;
  alloc_local = (FlatAllocator *)result;
  result_local = (EnumValueDescriptor *)parent;
  parent_local = (EnumDescriptor *)proto;
  proto_local = (EnumValueDescriptorProto *)this;
  std::__cxx11::string::string((string *)&scope_len);
  local_68 = EnumDescriptor::full_name((EnumDescriptor *)result_local);
  sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_68);
  local_88[0] = EnumDescriptor::name((EnumDescriptor *)result_local);
  sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_88);
  local_58 = sVar6 - sVar7;
  EnumValueDescriptorProto::name_abi_cxx11_((EnumValueDescriptorProto *)parent_local);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)&scope_len);
  local_98 = EnumDescriptor::full_name((EnumDescriptor *)result_local);
  pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_98);
  std::__cxx11::string::append((char *)&scope_len,(ulong)pvVar8);
  EnumValueDescriptorProto::name_abi_cxx11_((EnumValueDescriptorProto *)parent_local);
  std::__cxx11::string::append((string *)&scope_len);
  this_01 = full_name.field_2._8_8_;
  psVar9 = EnumValueDescriptorProto::name_abi_cxx11_((EnumValueDescriptorProto *)parent_local);
  psVar9 = protobuf::(anonymous_namespace)::
           FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
           ::AllocateStrings<std::__cxx11::string_const&,std::__cxx11::string>
                     ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                       *)this_01,psVar9,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &scope_len);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.
  super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.value
       = psVar9;
  iVar5 = EnumValueDescriptorProto::number((EnumValueDescriptorProto *)parent_local);
  *(int32_t *)
   ((long)&(alloc_local->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<char>.value + 4) = iVar5;
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value =
       (PointerT<google::protobuf::SourceCodeInfo>)result_local;
  psVar9 = EnumValueDescriptorProto::name_abi_cxx11_((EnumValueDescriptorProto *)parent_local);
  local_a8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar9)
  ;
  local_b8 = EnumValueDescriptor::full_name((EnumValueDescriptor *)alloc_local);
  ValidateSymbolName(this,local_a8,local_b8,(Message *)parent_local);
  pEVar2 = parent_local;
  descriptor = alloc_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_c8,
             "google.protobuf.EnumValueOptions");
  AllocateOptions<google::protobuf::EnumValueDescriptor>
            (this,(Proto *)pEVar2,(EnumValueDescriptor *)descriptor,3,_auStack_c8,
             (FlatAllocator *)full_name.field_2._8_8_);
  sVar13 = EnumValueDescriptor::full_name((EnumValueDescriptor *)alloc_local);
  pDVar10 = EnumDescriptor::containing_type((EnumDescriptor *)result_local);
  sVar14 = EnumValueDescriptor::name((EnumValueDescriptor *)alloc_local);
  pEVar2 = parent_local;
  SVar11 = Symbol::EnumValue((EnumValueDescriptor *)alloc_local,0);
  bVar3 = AddSymbol(this,sVar13,pDVar10,sVar14,(Message *)pEVar2,SVar11);
  parent_00 = result_local;
  this_00 = this->file_tables_;
  sVar13 = EnumValueDescriptor::name((EnumValueDescriptor *)alloc_local);
  SVar11 = Symbol::EnumValue((EnumValueDescriptor *)alloc_local,1);
  outer_scope.field_2._8_8_ = SVar11;
  bVar4 = FileDescriptorTables::AddAliasUnderParent(this_00,parent_00,sVar13,SVar11);
  sVar1._M_str = local_168._M_str;
  sVar1._M_len = local_168._M_len;
  sVar14._M_str = local_1a0._M_str;
  sVar14._M_len = local_1a0._M_len;
  sVar13._M_str = local_268._M_str;
  sVar13._M_len = local_268._M_len;
  if ((bVar4) && (local_268 = sVar13, local_1a0 = sVar14, local_168 = sVar1, !bVar3)) {
    std::__cxx11::string::string((string *)local_138);
    pDVar10 = EnumDescriptor::containing_type((EnumDescriptor *)result_local);
    if (pDVar10 == (Descriptor *)0x0) {
      local_168 = FileDescriptor::package(this->file_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_158,&local_168,&local_169);
      std::__cxx11::string::operator=((string *)local_138,local_158);
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator(&local_169);
    }
    else {
      pDVar10 = EnumDescriptor::containing_type((EnumDescriptor *)result_local);
      local_1a0 = Descriptor::full_name(pDVar10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_190,&local_1a0,&local_1a1);
      std::__cxx11::string::operator=((string *)local_138,local_190);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator(&local_1a1);
    }
    uVar12 = std::__cxx11::string::empty();
    if ((uVar12 & 1) == 0) {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_1f8,"\"");
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_258,"\"");
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_1c8,(lts_20250127 *)&local_1f8,&local_228,&local_258,(AlphaNum *)SVar11.ptr_
                );
      std::__cxx11::string::operator=((string *)local_138,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    else {
      std::__cxx11::string::operator=((string *)local_138,"the global scope");
    }
    local_268 = EnumValueDescriptor::full_name((EnumValueDescriptor *)alloc_local);
    pEVar2 = parent_local;
    local_290.result = (EnumValueDescriptor **)&alloc_local;
    local_290.outer_scope = (string *)local_138;
    local_290.parent = (EnumDescriptor **)&result_local;
    absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
    FunctionRef<google::protobuf::DescriptorBuilder::BuildEnumValue(google::protobuf::EnumValueDescriptorProto_const&,google::protobuf::EnumDescriptor_const*,google::protobuf::EnumValueDescriptor*,google::protobuf::internal::FlatAllocator&)::__0,void>
              ((FunctionRef<std::__cxx11::string()> *)&local_278,&local_290);
    make_error.invoker_ = p_Stack_270;
    make_error.ptr_.obj = local_278.obj;
    AddError(this,local_268,(Message *)pEVar2,NAME,make_error);
    std::__cxx11::string::~string((string *)local_138);
  }
  FileDescriptorTables::AddEnumValueByNumber(this->file_tables_,(EnumValueDescriptor *)alloc_local);
  std::__cxx11::string::~string((string *)&scope_len);
  return;
}

Assistant:

void DescriptorBuilder::BuildEnumValue(const EnumValueDescriptorProto& proto,
                                       const EnumDescriptor* parent,
                                       EnumValueDescriptor* result,
                                       internal::FlatAllocator& alloc) {
  // Note:  full_name for enum values is a sibling to the parent's name, not a
  //   child of it.
  std::string full_name;
  size_t scope_len = parent->full_name().size() - parent->name().size();
  full_name.reserve(scope_len + proto.name().size());
  full_name.append(parent->full_name().data(), scope_len);
  full_name.append(proto.name());

  result->all_names_ =
      alloc.AllocateStrings(proto.name(), std::move(full_name));
  result->number_ = proto.number();
  result->type_ = parent;

  ValidateSymbolName(proto.name(), result->full_name(), proto);

  // Copy options.
  AllocateOptions(proto, result, EnumValueDescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.EnumValueOptions", alloc);

  // Again, enum values are weird because we makes them appear as siblings
  // of the enum type instead of children of it.  So, we use
  // parent->containing_type() as the value's parent.
  bool added_to_outer_scope =
      AddSymbol(result->full_name(), parent->containing_type(), result->name(),
                proto, Symbol::EnumValue(result, 0));

  // However, we also want to be able to search for values within a single
  // enum type, so we add it as a child of the enum type itself, too.
  // Note:  This could fail, but if it does, the error has already been
  //   reported by the above AddSymbol() call, so we ignore the return code.
  bool added_to_inner_scope = file_tables_->AddAliasUnderParent(
      parent, result->name(), Symbol::EnumValue(result, 1));

  if (added_to_inner_scope && !added_to_outer_scope) {
    // This value did not conflict with any values defined in the same enum,
    // but it did conflict with some other symbol defined in the enum type's
    // scope.  Let's print an additional error to explain this.
    std::string outer_scope;
    if (parent->containing_type() == nullptr) {
      outer_scope = std::string(file_->package());
    } else {
      outer_scope = std::string(parent->containing_type()->full_name());
    }

    if (outer_scope.empty()) {
      outer_scope = "the global scope";
    } else {
      outer_scope = absl::StrCat("\"", outer_scope, "\"");
    }

    AddError(
        result->full_name(), proto, DescriptorPool::ErrorCollector::NAME, [&] {
          return absl::StrCat(
              "Note that enum values use C++ scoping rules, meaning that "
              "enum values are siblings of their type, not children of it.  "
              "Therefore, \"",
              result->name(), "\" must be unique within ", outer_scope,
              ", not just within \"", parent->name(), "\".");
        });
  }

  // An enum is allowed to define two numbers that refer to the same value.
  // FindValueByNumber() should return the first such value, so we simply
  // ignore AddEnumValueByNumber()'s return code.
  file_tables_->AddEnumValueByNumber(result);
}